

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_params.c
# Opt level: O0

size_t ecpDetIsZero_deep(size_t n)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  long in_RDI;
  size_t in_stack_ffffffffffffffe0;
  
  sVar1 = zzSqrMod_deep(in_stack_ffffffffffffffe0);
  sVar2 = zzMulMod_deep(sVar1);
  sVar3 = zzMulWMod_deep(sVar1);
  sVar1 = utilMax(3,sVar1,sVar2,sVar3);
  return in_RDI * 0x10 + sVar1;
}

Assistant:

size_t ecpDetIsZero_deep(size_t n)
{
	return O_OF_W(2 * n) +
		utilMax(3,
			zzSqrMod_deep(n),
			zzMulMod_deep(n),
			zzMulWMod_deep(n)
		);
}